

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

NodesSeq<dg::dda::RWNode> * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createNode
          (NodesSeq<dg::dda::RWNode> *__return_storage_ptr__,LLVMReadWriteGraphBuilder *this,
          Value *v)

{
  uint uVar1;
  Value VVar2;
  LLVMDataDependenceAnalysisOptions *pLVar3;
  RWNodeType t;
  StringRef SVar4;
  StringRef SVar5;
  StringRef SVar6;
  StringRef SVar7;
  bool bVar8;
  RWNode *pRVar9;
  long lVar10;
  FunctionModel *pFVar11;
  StringRef SVar12;
  StringRef local_68;
  string local_58;
  
  SVar7.Length = local_68.Length;
  SVar7.Data = local_68.Data;
  SVar6.Length = local_68.Length;
  SVar6.Data = local_68.Data;
  SVar12.Length = local_68.Length;
  SVar12.Data = local_68.Data;
  VVar2 = v[0x10];
  if (VVar2 == (Value)0x3) {
    t = GLOBAL;
LAB_0012055c:
    pRVar9 = ReadWriteGraph::create(&this->graph,t);
    goto LAB_00120565;
  }
  if ((byte)VVar2 < 0x1b) goto switchD_001205bf_caseD_3d;
  local_68 = SVar12;
  switch(VVar2) {
  case (Value)0x3a:
    pRVar9 = createAlloc(this,(Instruction *)v);
    break;
  case (Value)0x3b:
    local_68 = SVar7;
    if (this->buildUses != true) goto switchD_001205bf_caseD_3d;
    pRVar9 = createLoad(this,(Instruction *)v);
    break;
  case (Value)0x3c:
    pRVar9 = createStore(this,(Instruction *)v);
    break;
  case (Value)0x3d:
  case (Value)0x3e:
  case (Value)0x3f:
    goto switchD_001205bf_caseD_3d;
  case (Value)0x40:
    pRVar9 = createAtomicRMW(this,(Instruction *)v);
    break;
  default:
    if (VVar2 == (Value)0x1c) {
      t = RETURN;
      goto LAB_0012055c;
    }
    local_68 = SVar6;
    if (VVar2 == (Value)0x53) {
      pLVar3 = this->_options;
      bVar8 = llvm::DbgValueInst::classof(v);
      if (!bVar8) {
        lVar10 = llvm::Value::stripPointerCasts();
        SVar5.Length = local_68.Length;
        SVar5.Data = local_68.Data;
        SVar4.Length = local_68.Length;
        SVar4.Data = local_68.Data;
        if (((lVar10 == 0) || (local_68 = SVar4, *(char *)(lVar10 + 0x10) != '\0')) ||
           (local_68 = SVar5, *(long *)(lVar10 + 0x48) != lVar10 + 0x48)) {
LAB_001206c5:
          createCall(__return_storage_ptr__,this,(Instruction *)v);
          return __return_storage_ptr__;
        }
        local_68 = (StringRef)llvm::Value::getName();
        llvm::StringRef::str_abi_cxx11_(&local_58,&local_68);
        pFVar11 = DataDependenceAnalysisOptions::getFunctionModel
                            ((DataDependenceAnalysisOptions *)(pLVar3 + 0x20),&local_58);
        std::__cxx11::string::_M_dispose();
        if (pFVar11 != (FunctionModel *)0x0) goto LAB_001206c5;
        SVar12 = (StringRef)llvm::Value::getName();
        local_68 = SVar12;
        llvm::StringRef::str_abi_cxx11_(&local_58,&local_68);
        bVar8 = AnalysisOptions::isAllocationFunction((AnalysisOptions *)(pLVar3 + 0x20),&local_58);
        std::__cxx11::string::_M_dispose();
        if ((bVar8) || ((*(byte *)(lVar10 + 0x21) & 0x20) == 0)) goto LAB_001206c5;
        uVar1 = *(int *)(lVar10 + 0x24) - 0xbf;
        if (((uVar1 < 6) && ((0x29U >> (uVar1 & 0x1f) & 1) != 0)) ||
           (*(int *)(lVar10 + 0x24) == 0x134)) goto LAB_001206c5;
      }
    }
    goto switchD_001205bf_caseD_3d;
  }
LAB_00120565:
  local_68.Data = (char *)pRVar9;
  local_58._M_dataplus._M_p = (pointer)&local_68;
  local_58._M_string_length = 1;
LAB_0012058c:
  NodesSeq<dg::dda::RWNode>::NodesSeq
            (__return_storage_ptr__,(initializer_list<dg::dda::RWNode_*> *)&local_58);
  return __return_storage_ptr__;
switchD_001205bf_caseD_3d:
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  goto LAB_0012058c;
}

Assistant:

NodesSeq<RWNode> LLVMReadWriteGraphBuilder::createNode(const llvm::Value *v) {
    using namespace llvm;
    if (isa<GlobalVariable>(v)) {
        // global variables are like allocations
        return {&create(RWNodeType::GLOBAL)};
    }

    const auto *I = dyn_cast<Instruction>(v);
    if (!I)
        return {};

    // we may created this node when searching for an operand
    switch (I->getOpcode()) {
    case Instruction::Alloca:
        // we need alloca's as target to DefSites
        return {createAlloc(I)};
    case Instruction::Store:
        return {createStore(I)};
    case Instruction::AtomicRMW:
        return {createAtomicRMW(I)};
    case Instruction::Load:
        if (buildUses) {
            return {createLoad(I)};
        }
        break;
    case Instruction::Ret:
        // we need create returns, since
        // these modify CFG and thus data-flow
        return {createReturn(I)};
    case Instruction::Call:
        if (!isRelevantCall(I, _options))
            break;

        return createCall(I);
    }

    return {};
}